

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdVerifyPsbtTxIn(void *handle,void *psbt_handle,char *txid,uint32_t vout)

{
  pointer *ppuVar1;
  Psbt *this;
  bool bVar2;
  CfdException *pCVar3;
  Txid txid_obj;
  allocator local_79;
  OutPoint local_78;
  Txid local_50;
  
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_78.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
  local_78.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_78);
  if (local_78.txid_._vptr_Txid != (_func_int **)ppuVar1) {
    operator_delete(local_78.txid_._vptr_Txid);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (!bVar2) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      std::__cxx11::string::string((string *)&local_78,txid,&local_79);
      cfd::core::Txid::Txid(&local_50,(string *)&local_78);
      if (local_78.txid_._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(local_78.txid_._vptr_Txid);
      }
      this = *(Psbt **)((long)psbt_handle + 0x18);
      cfd::core::OutPoint::OutPoint(&local_78,&local_50,vout);
      cfd::Psbt::Verify(this,&local_78);
      local_78.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if ((void *)CONCAT44(local_78.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_78.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_78.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_78.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      local_50._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_78.txid_._vptr_Txid = (_func_int **)0x5f58da;
    local_78.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x964;
    local_78.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdVerifyPsbtTxIn";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"psbt is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78.txid_._vptr_Txid = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_78);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_78.txid_._vptr_Txid = (_func_int **)0x5f58da;
  local_78.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x95e;
  local_78.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdVerifyPsbtTxIn";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_78);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyPsbtTxIn(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Txid txid_obj(txid);
    psbt_obj->psbt->Verify(OutPoint(txid_obj, vout));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
    if (std::string(except.what()) == "psbt txin not finalized yet.") {
      result = kCfdSignVerificationError;
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}